

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.h
# Opt level: O2

void SpookyHash::Mix(uint64 *data,uint64 *s0,uint64 *s1,uint64 *s2,uint64 *s3,uint64 *s4,uint64 *s5,
                    uint64 *s6,uint64 *s7,uint64 *s8,uint64 *s9,uint64 *s10,uint64 *s11)

{
  *s0 = *s0 + *data;
  *s2 = *s2 ^ *s10;
  *s11 = *s11 ^ *s0;
  *s0 = *s0 << 0xb | *s0 >> 0x35;
  *s11 = *s11 + *s1;
  *s1 = *s1 + data[1];
  *s3 = *s3 ^ *s11;
  *s0 = *s0 ^ *s1;
  *s1 = *s1 << 0x20 | *s1 >> 0x20;
  *s0 = *s0 + *s2;
  *s2 = *s2 + data[2];
  *s4 = *s4 ^ *s0;
  *s1 = *s1 ^ *s2;
  *s2 = *s2 << 0x2b | *s2 >> 0x15;
  *s1 = *s1 + *s3;
  *s3 = *s3 + data[3];
  *s5 = *s5 ^ *s1;
  *s2 = *s2 ^ *s3;
  *s3 = *s3 << 0x1f | *s3 >> 0x21;
  *s2 = *s2 + *s4;
  *s4 = *s4 + data[4];
  *s6 = *s6 ^ *s2;
  *s3 = *s3 ^ *s4;
  *s4 = *s4 << 0x11 | *s4 >> 0x2f;
  *s3 = *s3 + *s5;
  *s5 = *s5 + data[5];
  *s7 = *s7 ^ *s3;
  *s4 = *s4 ^ *s5;
  *s5 = *s5 << 0x1c | *s5 >> 0x24;
  *s4 = *s4 + *s6;
  *s6 = *s6 + data[6];
  *s8 = *s8 ^ *s4;
  *s5 = *s5 ^ *s6;
  *s6 = *s6 << 0x27 | *s6 >> 0x19;
  *s5 = *s5 + *s7;
  *s7 = *s7 + data[7];
  *s9 = *s9 ^ *s5;
  *s6 = *s6 ^ *s7;
  *s7 = *s7 << 0x39 | *s7 >> 7;
  *s6 = *s6 + *s8;
  *s8 = *s8 + data[8];
  *s10 = *s10 ^ *s6;
  *s7 = *s7 ^ *s8;
  *s8 = *s8 << 0x37 | *s8 >> 9;
  *s7 = *s7 + *s9;
  *s9 = *s9 + data[9];
  *s11 = *s11 ^ *s7;
  *s8 = *s8 ^ *s9;
  *s9 = *s9 << 0x36 | *s9 >> 10;
  *s8 = *s8 + *s10;
  *s10 = *s10 + data[10];
  *s0 = *s0 ^ *s8;
  *s9 = *s9 ^ *s10;
  *s10 = *s10 << 0x16 | *s10 >> 0x2a;
  *s9 = *s9 + *s11;
  *s11 = *s11 + data[0xb];
  *s1 = *s1 ^ *s9;
  *s10 = *s10 ^ *s11;
  *s11 = *s11 << 0x2e | *s11 >> 0x12;
  *s10 = *s10 + *s0;
  return;
}

Assistant:

static INLINE void Mix(
        const uint64 *data, 
        uint64 &s0, uint64 &s1, uint64 &s2, uint64 &s3,
        uint64 &s4, uint64 &s5, uint64 &s6, uint64 &s7,
        uint64 &s8, uint64 &s9, uint64 &s10,uint64 &s11)
    {
      s0 += data[0];    s2 ^= s10;    s11 ^= s0;    s0 = Rot64(s0,11);    s11 += s1;
      s1 += data[1];    s3 ^= s11;    s0 ^= s1;    s1 = Rot64(s1,32);    s0 += s2;
      s2 += data[2];    s4 ^= s0;    s1 ^= s2;    s2 = Rot64(s2,43);    s1 += s3;
      s3 += data[3];    s5 ^= s1;    s2 ^= s3;    s3 = Rot64(s3,31);    s2 += s4;
      s4 += data[4];    s6 ^= s2;    s3 ^= s4;    s4 = Rot64(s4,17);    s3 += s5;
      s5 += data[5];    s7 ^= s3;    s4 ^= s5;    s5 = Rot64(s5,28);    s4 += s6;
      s6 += data[6];    s8 ^= s4;    s5 ^= s6;    s6 = Rot64(s6,39);    s5 += s7;
      s7 += data[7];    s9 ^= s5;    s6 ^= s7;    s7 = Rot64(s7,57);    s6 += s8;
      s8 += data[8];    s10 ^= s6;    s7 ^= s8;    s8 = Rot64(s8,55);    s7 += s9;
      s9 += data[9];    s11 ^= s7;    s8 ^= s9;    s9 = Rot64(s9,54);    s8 += s10;
      s10 += data[10];    s0 ^= s8;    s9 ^= s10;    s10 = Rot64(s10,22);    s9 += s11;
      s11 += data[11];    s1 ^= s9;    s10 ^= s11;    s11 = Rot64(s11,46);    s10 += s0;
    }